

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::anon_unknown_0::
AssignDescriptorsHelper<google::protobuf::internal::MigrationSchema>::AssignMessageDescriptor
          (AssignDescriptorsHelper<google::protobuf::internal::MigrationSchema> *this,
          Descriptor *descriptor)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Descriptor *pDVar4;
  MessageOptions *this_00;
  GeneratedMessageReflection *this_01;
  DescriptorPool *pool;
  EnumDescriptor *descriptor_00;
  int in_R9D;
  MigrationSchema migration_schema;
  int local_80;
  int i_1;
  ReflectionSchema local_50;
  int local_1c;
  Descriptor *pDStack_18;
  int i;
  Descriptor *descriptor_local;
  AssignDescriptorsHelper<google::protobuf::internal::MigrationSchema> *this_local;
  
  local_1c = 0;
  pDStack_18 = descriptor;
  descriptor_local = (Descriptor *)this;
  while( true ) {
    iVar3 = local_1c;
    iVar2 = Descriptor::nested_type_count(pDStack_18);
    if (iVar2 <= iVar3) break;
    pDVar4 = Descriptor::nested_type(pDStack_18,local_1c);
    AssignMessageDescriptor(this,pDVar4);
    local_1c = local_1c + 1;
  }
  this->file_level_metadata_->descriptor = pDStack_18;
  this_00 = Descriptor::options(pDStack_18);
  bVar1 = MessageOptions::map_entry(this_00);
  if (!bVar1) {
    this_01 = (GeneratedMessageReflection *)operator_new(0x58);
    pDVar4 = pDStack_18;
    migration_schema.has_bit_indices_index = 0;
    migration_schema.offsets_index = this->schemas_->object_size;
    migration_schema.object_size = in_R9D;
    MigrationToReflectionSchema
              (&local_50,(anon_unknown_0 *)this->default_instance_data_,(Message **)this->offsets_,
               *(uint32 **)this->schemas_,migration_schema);
    pool = DescriptorPool::generated_pool();
    GeneratedMessageReflection::GeneratedMessageReflection
              (this_01,pDVar4,&local_50,pool,this->factory_);
    this->file_level_metadata_->reflection = (Reflection *)this_01;
    local_80 = 0;
    while( true ) {
      iVar3 = Descriptor::enum_type_count(pDStack_18);
      if (iVar3 <= local_80) break;
      descriptor_00 = Descriptor::enum_type(pDStack_18,local_80);
      AssignEnumDescriptor(this,descriptor_00);
      local_80 = local_80 + 1;
    }
    this->schemas_ = this->schemas_ + 1;
  }
  this->default_instance_data_ = this->default_instance_data_ + 1;
  this->file_level_metadata_ = this->file_level_metadata_ + 1;
  return;
}

Assistant:

void AssignMessageDescriptor(const Descriptor* descriptor) {
    for (int i = 0; i < descriptor->nested_type_count(); i++) {
      AssignMessageDescriptor(descriptor->nested_type(i));
    }

    file_level_metadata_->descriptor = descriptor;

    if (!descriptor->options().map_entry()) {
      // Only set reflection for non map types.
      file_level_metadata_->reflection = new GeneratedMessageReflection(
          descriptor, MigrationToReflectionSchema(default_instance_data_,
                                                  offsets_, *schemas_),
          ::google::protobuf::DescriptorPool::generated_pool(), factory_);
      for (int i = 0; i < descriptor->enum_type_count(); i++) {
        AssignEnumDescriptor(descriptor->enum_type(i));
      }
      schemas_++;
    }
    default_instance_data_++;
    file_level_metadata_++;
  }